

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O1

vector<State_*,_std::allocator<State_*>_> *
vectorUnion(vector<State_*,_std::allocator<State_*>_> *__return_storage_ptr__,
           vector<State_*,_std::allocator<State_*>_> *a,vector<State_*,_std::allocator<State_*>_> *b
           )

{
  pointer ppSVar1;
  pointer ppSVar2;
  State *state;
  State *local_30;
  
  (__return_storage_ptr__->super__Vector_base<State_*,_std::allocator<State_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<State_*,_std::allocator<State_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<State_*,_std::allocator<State_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar2 = (a->super__Vector_base<State_*,_std::allocator<State_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (a->super__Vector_base<State_*,_std::allocator<State_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar2 != ppSVar1) {
    do {
      local_30 = *ppSVar2;
      std::vector<State*,std::allocator<State*>>::emplace_back<State*&>
                ((vector<State*,std::allocator<State*>> *)__return_storage_ptr__,&local_30);
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 != ppSVar1);
  }
  ppSVar2 = (b->super__Vector_base<State_*,_std::allocator<State_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (b->super__Vector_base<State_*,_std::allocator<State_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar2 != ppSVar1) {
    do {
      local_30 = *ppSVar2;
      std::vector<State*,std::allocator<State*>>::emplace_back<State*&>
                ((vector<State*,std::allocator<State*>> *)__return_storage_ptr__,&local_30);
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 != ppSVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<State *> vectorUnion(const std::vector<State *> &a, const std::vector<State *> &b) {

    std::vector<State *> vecUnion = {};

    for (State *state: a) {
        vecUnion.emplace_back(state);
    }

    for (State *state: b) {
        vecUnion.emplace_back(state);
    }

    return vecUnion;
}